

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O3

void __thiscall
cmdline::parser::option_without_value::~option_without_value(option_without_value *this)

{
  ~option_without_value(this);
  operator_delete(this,0x58);
  return;
}

Assistant:

~option_without_value(){}